

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O3

AffineSpace3fa *
embree::calculate_interpolated_space
          (AffineSpace3fa *__return_storage_ptr__,ISPCInstanceArray *instanceArray,uint primID,
          float gtime)

{
  AffineSpace3fa *pAVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  Vector *pVVar5;
  uint uVar6;
  AffineSpace3fa *pAVar7;
  AffineSpace3fa *pAVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  uVar6 = instanceArray->numTimeSteps;
  if (uVar6 == 1) {
    pAVar7 = *instanceArray->spaces_array;
    pAVar1 = pAVar7 + primID;
    fVar11 = (pAVar1->l).vx.field_0.m128[0];
    fVar14 = (pAVar1->l).vx.field_0.m128[1];
    fVar15 = (pAVar1->l).vx.field_0.m128[2];
    fVar16 = (pAVar1->l).vx.field_0.m128[3];
    pVVar2 = &pAVar7[primID].l.vy;
    fVar17 = (pVVar2->field_0).m128[0];
    fVar18 = (pVVar2->field_0).m128[1];
    fVar19 = (pVVar2->field_0).m128[2];
    fVar20 = (pVVar2->field_0).m128[3];
    pVVar2 = &pAVar7[primID].l.vz;
    fVar21 = (pVVar2->field_0).m128[0];
    fVar22 = (pVVar2->field_0).m128[1];
    fVar23 = (pVVar2->field_0).m128[2];
    fVar24 = (pVVar2->field_0).m128[3];
    pVVar2 = &pAVar7[primID].p;
    fVar25 = (pVVar2->field_0).m128[0];
    fVar26 = (pVVar2->field_0).m128[1];
    fVar27 = (pVVar2->field_0).m128[2];
    fVar13 = (pVVar2->field_0).m128[3];
  }
  else {
    fVar13 = (float)(int)(uVar6 - 1) * gtime;
    fVar11 = floorf(fVar13);
    uVar9 = uVar6 - 2;
    if ((int)fVar11 < (int)(uVar6 - 2)) {
      uVar9 = (int)fVar11;
    }
    uVar10 = 0;
    if (0 < (int)uVar9) {
      uVar10 = (ulong)uVar9;
    }
    fVar13 = fVar13 - (float)(int)uVar10;
    fVar12 = 1.0 - fVar13;
    pAVar7 = instanceArray->spaces_array[uVar10];
    pAVar8 = instanceArray->spaces_array[uVar10 + 1];
    pAVar1 = pAVar7 + primID;
    pVVar2 = &pAVar7[primID].l.vy;
    pVVar3 = &pAVar7[primID].l.vz;
    pVVar4 = &pAVar7[primID].p;
    pAVar7 = pAVar8 + primID;
    fVar11 = (pAVar7->l).vx.field_0.m128[0] * fVar13 + (pAVar1->l).vx.field_0.m128[0] * fVar12;
    fVar14 = (pAVar7->l).vx.field_0.m128[1] * fVar13 + (pAVar1->l).vx.field_0.m128[1] * fVar12;
    fVar15 = (pAVar7->l).vx.field_0.m128[2] * fVar13 + (pAVar1->l).vx.field_0.m128[2] * fVar12;
    fVar16 = (pAVar7->l).vx.field_0.m128[3] * fVar13 + (pAVar1->l).vx.field_0.m128[3] * fVar12;
    pVVar5 = &pAVar8[primID].l.vy;
    fVar17 = (pVVar5->field_0).m128[0] * fVar13 + (pVVar2->field_0).m128[0] * fVar12;
    fVar18 = (pVVar5->field_0).m128[1] * fVar13 + (pVVar2->field_0).m128[1] * fVar12;
    fVar19 = (pVVar5->field_0).m128[2] * fVar13 + (pVVar2->field_0).m128[2] * fVar12;
    fVar20 = (pVVar5->field_0).m128[3] * fVar13 + (pVVar2->field_0).m128[3] * fVar12;
    pVVar2 = &pAVar8[primID].l.vz;
    fVar21 = (pVVar2->field_0).m128[0] * fVar13 + (pVVar3->field_0).m128[0] * fVar12;
    fVar22 = (pVVar2->field_0).m128[1] * fVar13 + (pVVar3->field_0).m128[1] * fVar12;
    fVar23 = (pVVar2->field_0).m128[2] * fVar13 + (pVVar3->field_0).m128[2] * fVar12;
    fVar24 = (pVVar2->field_0).m128[3] * fVar13 + (pVVar3->field_0).m128[3] * fVar12;
    pVVar2 = &pAVar8[primID].p;
    fVar25 = fVar13 * (pVVar2->field_0).m128[0] + fVar12 * (pVVar4->field_0).m128[0];
    fVar26 = fVar13 * (pVVar2->field_0).m128[1] + fVar12 * (pVVar4->field_0).m128[1];
    fVar27 = fVar13 * (pVVar2->field_0).m128[2] + fVar12 * (pVVar4->field_0).m128[2];
    fVar13 = fVar13 * (pVVar2->field_0).m128[3] + fVar12 * (pVVar4->field_0).m128[3];
  }
  (__return_storage_ptr__->l).vx.field_0.m128[0] = fVar11;
  (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar14;
  (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar15;
  (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar16;
  (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar17;
  (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar18;
  (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar19;
  (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar20;
  (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar21;
  (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar22;
  (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar23;
  (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar24;
  (__return_storage_ptr__->p).field_0.m128[0] = fVar25;
  (__return_storage_ptr__->p).field_0.m128[1] = fVar26;
  (__return_storage_ptr__->p).field_0.m128[2] = fVar27;
  (__return_storage_ptr__->p).field_0.m128[3] = fVar13;
  return __return_storage_ptr__;
}

Assistant:

AffineSpace3fa calculate_interpolated_space (ISPCInstanceArray* instanceArray, unsigned int primID, float gtime)
{
  if (instanceArray->numTimeSteps == 1)
    return AffineSpace3fa(instanceArray->spaces_array[0][primID]);

   /* calculate time segment itime and fractional time ftime */
  const int time_segments = instanceArray->numTimeSteps-1;
  const float time = gtime*(float)(time_segments);
  const int itime = clamp((int)(floor(time)),(int)0,time_segments-1);
  const float ftime = time - (float)(itime);
  return (1.0f-ftime)*AffineSpace3fa(instanceArray->spaces_array[itime+0][primID]) + ftime*AffineSpace3fa(instanceArray->spaces_array[itime+1][primID]);
}